

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

void __thiscall
cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
          (DescriptorKeyInfo *this,string *key,string *parent_key_information)

{
  SchnorrPubkey *this_00;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  pointer __dest;
  CfdException *this_01;
  long lVar4;
  size_t __n;
  ulong uVar5;
  ByteData bytes;
  string errmsg;
  SchnorrPubkey schnorr;
  string hdkey_top;
  ByteData local_180;
  string *local_160;
  Privkey *local_158;
  undefined1 local_150 [40];
  ByteData256 local_128;
  ByteData local_110;
  bool local_f8;
  undefined3 uStack_f7;
  NetType NStack_f4;
  ByteData local_f0;
  ByteData256 local_d8;
  string *local_c0;
  ByteData local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  Pubkey *local_88;
  string *local_80;
  SchnorrPubkey local_78;
  ExtPubkey *local_60;
  ExtPrivkey *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  this_00 = &this->schnorr_pubkey_;
  SchnorrPubkey::SchnorrPubkey(this_00);
  local_88 = &this->pubkey_;
  Pubkey::Pubkey(local_88);
  local_158 = &this->privkey_;
  Privkey::Privkey(local_158);
  local_58 = &this->extprivkey_;
  ExtPrivkey::ExtPrivkey(local_58);
  local_60 = &this->extpubkey_;
  ExtPubkey::ExtPubkey(local_60);
  local_90 = &(this->parent_info_).field_2;
  (this->parent_info_)._M_dataplus._M_p = (pointer)local_90;
  (this->parent_info_)._M_string_length = 0;
  (this->parent_info_).field_2._M_local_buf[0] = '\0';
  local_80 = &this->path_;
  local_98 = &(this->path_).field_2;
  (this->path_)._M_dataplus._M_p = (pointer)local_98;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  local_c0 = (string *)&this->key_string_;
  local_a0 = &(this->key_string_).field_2;
  (this->key_string_)._M_dataplus._M_p = (pointer)local_a0;
  (this->key_string_)._M_string_length = 0;
  (this->key_string_).field_2._M_local_buf[0] = '\0';
  if (key->_M_string_length < 4) {
    this_01 = (CfdException *)__cxa_allocate_exception(0x30);
    local_150._0_8_ = local_150 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"DescriptorKeyInfo illegal key.","");
    CfdException::CfdException(this_01,kCfdIllegalArgumentError,(string *)local_150);
    __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::__cxx11::string::substr((ulong)local_50,(ulong)key);
  iVar3 = ::std::__cxx11::string::compare((char *)local_50);
  if ((iVar3 == 0) || (iVar3 = ::std::__cxx11::string::compare((char *)local_50), iVar3 == 0)) {
    pcVar1 = local_150 + 0x10;
    local_150._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"/","");
    StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_180,(string *)key,(string *)local_150);
    local_160 = parent_key_information;
    if ((pointer)local_150._0_8_ != pcVar1) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    if (0x20 < (ulong)((long)local_180.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_180.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start)) {
      uVar5 = 1;
      lVar4 = 0x20;
      do {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_150,"/",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((_Alloc_hider *)
                                 local_180.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->_M_p + lVar4));
        ::std::__cxx11::string::_M_append((char *)local_80,local_150._0_8_);
        if ((pointer)local_150._0_8_ != pcVar1) {
          operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
        }
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x20;
      } while (uVar5 < (ulong)((long)local_180.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_180.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    iVar3 = ::std::__cxx11::string::compare((char *)local_50);
    if (iVar3 == 0) {
      this->key_type_ = kDescriptorKeyBip32Priv;
      ExtPrivkey::ExtPrivkey
                ((ExtPrivkey *)local_150,
                 (string *)
                 local_180.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      parent_key_information = local_160;
      (this->extprivkey_).super_Extkey.version_ = local_150._0_4_;
      ByteData::operator=(&(this->extprivkey_).super_Extkey.fingerprint_,(ByteData *)(local_150 + 8)
                         );
      (this->extprivkey_).super_Extkey.depth_ = local_150[0x20];
      *(undefined3 *)&(this->extprivkey_).super_Extkey.field_0x21 = local_150._33_3_;
      (this->extprivkey_).super_Extkey.child_num_ = local_150._36_4_;
      ByteData256::operator=(&(this->extprivkey_).super_Extkey.chaincode_,&local_128);
      ByteData::operator=(&(this->extprivkey_).super_Extkey.privkey_.data_,&local_110);
      (this->extprivkey_).super_Extkey.privkey_.is_compressed_ = local_f8;
      *(undefined3 *)&(this->extprivkey_).super_Extkey.privkey_.field_0x19 = uStack_f7;
      (this->extprivkey_).super_Extkey.privkey_.net_type_ = NStack_f4;
      ByteData::operator=(&(this->extprivkey_).super_Extkey.pubkey_.data_,&local_f0);
      ByteData256::operator=(&(this->extprivkey_).super_Extkey.tweak_sum_,&local_d8);
    }
    else {
      this->key_type_ = kDescriptorKeyBip32;
      ExtPubkey::ExtPubkey
                ((ExtPubkey *)local_150,
                 (string *)
                 local_180.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      parent_key_information = local_160;
      (this->extpubkey_).super_Extkey.version_ = local_150._0_4_;
      ByteData::operator=(&(this->extpubkey_).super_Extkey.fingerprint_,(ByteData *)(local_150 + 8))
      ;
      (this->extpubkey_).super_Extkey.depth_ = local_150[0x20];
      *(undefined3 *)&(this->extpubkey_).super_Extkey.field_0x21 = local_150._33_3_;
      (this->extpubkey_).super_Extkey.child_num_ = local_150._36_4_;
      ByteData256::operator=(&(this->extpubkey_).super_Extkey.chaincode_,&local_128);
      ByteData::operator=(&(this->extpubkey_).super_Extkey.privkey_.data_,&local_110);
      (this->extpubkey_).super_Extkey.privkey_.is_compressed_ = local_f8;
      *(undefined3 *)&(this->extpubkey_).super_Extkey.privkey_.field_0x19 = uStack_f7;
      (this->extpubkey_).super_Extkey.privkey_.net_type_ = NStack_f4;
      ByteData::operator=(&(this->extpubkey_).super_Extkey.pubkey_.data_,&local_f0);
      ByteData256::operator=(&(this->extpubkey_).super_Extkey.tweak_sum_,&local_d8);
    }
    if (local_d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_110.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_110.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_110.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_128.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_150._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_150._8_8_,local_150._24_8_ - local_150._8_8_);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_180);
  }
  else {
    this->key_type_ = kDescriptorKeyPublic;
    ByteData::ByteData(&local_180,key);
    bVar2 = Pubkey::IsValid(&local_180);
    if (bVar2) {
      local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar5 = (long)local_180.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_180.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar5 == 0) {
        __dest = (pointer)0x0;
        __n = 0;
        local_160 = parent_key_information;
      }
      else {
        if ((long)uVar5 < 0) {
          local_160 = parent_key_information;
          ::std::__throw_bad_alloc();
        }
        local_160 = parent_key_information;
        __dest = (pointer)operator_new(uVar5);
        __n = (long)local_180.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_180.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __dest + uVar5;
      local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = __dest;
      if (local_180.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_180.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = __dest;
        memmove(__dest,local_180.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,__n);
      }
      parent_key_information = local_160;
      local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = __dest + __n;
      Pubkey::Pubkey((Pubkey *)local_150,&local_b8);
      ByteData::operator=(&local_88->data_,(ByteData *)local_150);
      local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start =
           local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage =
           local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      if ((pointer)local_150._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ - local_150._0_8_);
        local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
    }
    else {
      SchnorrPubkey::SchnorrPubkey(&local_78,&local_180);
      ByteData256::operator=(&this_00->data_,&local_78.data_);
      SchnorrPubkey::GetHex_abi_cxx11_((string *)local_150,this_00);
      ::std::__cxx11::string::operator=(local_c0,(string *)local_150);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      this->key_type_ = kDescriptorKeySchnorr;
    }
    if (local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((string *)
        local_180.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (string *)0x0) {
      operator_delete(local_180.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_180.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_180.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (parent_key_information->_M_string_length != 0) {
    ::std::__cxx11::string::_M_assign((string *)&this->parent_info_);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

DescriptorKeyInfo::DescriptorKeyInfo(
    const std::string& key, const std::string parent_key_information) {
  if (key.size() < 4) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "DescriptorKeyInfo illegal key.");
  }
  // analyze format
  std::string hdkey_top = key.substr(1, 3);
  if ((hdkey_top == "pub") || (hdkey_top == "prv")) {
    std::vector<std::string> list = StringUtil::Split(key, "/");
    for (size_t index = 1; index < list.size(); ++index) {
      path_ += "/" + list[index];
    }
    if (hdkey_top == "prv") {
      key_type_ = DescriptorKeyType::kDescriptorKeyBip32Priv;
      extprivkey_ = ExtPrivkey(list[0]);
    } else {
      key_type_ = DescriptorKeyType::kDescriptorKeyBip32;
      extpubkey_ = ExtPubkey(list[0]);
    }
  } else {
    key_type_ = DescriptorKeyType::kDescriptorKeyPublic;
    bool is_wif = false;
    try {
      // pubkey format check
      ByteData bytes(key);
      if (Pubkey::IsValid(bytes)) {
        // pubkey
        pubkey_ = Pubkey(bytes);
      } else {
        // schnorr pubkey
        SchnorrPubkey schnorr(bytes);
        schnorr_pubkey_ = schnorr;
        key_string_ = schnorr_pubkey_.GetHex();
        key_type_ = DescriptorKeyType::kDescriptorKeySchnorr;
      }
    } catch (const CfdException& except) {
      std::string errmsg(except.what());
      if (Privkey::HasWif(key)) {
        is_wif = true;
      } else {
        throw except;
      }
    }
    if (is_wif) {
      Privkey privkey;
      // privkey WIF check
      try {
        privkey_ = Privkey::FromWif(key, NetType::kMainnet);
      } catch (const CfdException& except) {
        std::string errmsg(except.what());
        if (errmsg.find("Error WIF to Private key.") == std::string::npos) {
          throw except;
        }
      }
      if (!privkey_.IsValid()) {
        privkey_ = Privkey::FromWif(key, NetType::kTestnet);
      }
      key_string_ = privkey_.GetWif();
    }
  }

  if (!parent_key_information.empty()) {
    parent_info_ = parent_key_information;
  }
}